

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O2

void __thiscall Fl_Counter::draw(Fl_Counter *this)

{
  byte bVar1;
  byte bVar2;
  int X;
  int W;
  int iVar3;
  Fl_Color FVar4;
  Fl_Boxtype FVar5;
  ulong uVar6;
  int iVar7;
  int X_00;
  Fl_Boxtype t;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e0;
  Fl_Boxtype local_d4 [7];
  char str [128];
  
  bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.box_;
  FVar5 = FL_DOWN_BOX;
  if (bVar1 != FL_UP_BOX) {
    FVar5 = (uint)bVar1;
  }
  t = FL_THIN_DOWN_BOX;
  if (FVar5 != FL_THIN_UP_BOX) {
    t = FVar5;
  }
  bVar2 = this->mouseobj;
  for (uVar6 = 1; uVar6 != 5; uVar6 = uVar6 + 1) {
    local_d4[uVar6 - 1] = (uint)((bVar2 == uVar6 && 1 < bVar1) | bVar1);
  }
  iVar7 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
    W = (iVar7 * 0xf) / 100;
    X = (this->super_Fl_Valuator).super_Fl_Widget.x_;
    local_e0 = W + X;
    X_00 = X + W * 2;
    local_ec = X + iVar7 + W * -2;
    local_f0 = (X + iVar7) - W;
    iVar3 = W << 2;
    local_f4 = W;
  }
  else {
    W = iVar7 / 5;
    local_e0 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
    X_00 = local_e0 + W;
    local_ec = (local_e0 + iVar7) - W;
    iVar3 = W * 2;
    local_f0 = 0;
    X = 0;
    local_f4 = 0;
  }
  iVar7 = iVar7 - iVar3;
  Fl_Widget::draw_box((Fl_Widget *)this,t,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
                      (this->super_Fl_Valuator).super_Fl_Widget.h_,7);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)&(this->super_Fl_Valuator).field_0xa4,
             (ulong)(uint)this->textsize_);
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  FVar4 = this->textcolor_;
  if (iVar3 == 0) {
    FVar4 = fl_inactive(FVar4);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,str);
  fl_draw(str,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
          (this->super_Fl_Valuator).super_Fl_Widget.h_,0,(Fl_Image *)0x0,1);
  if ((Fl_Counter *)Fl::focus_ == this) {
    Fl_Widget::draw_focus
              ((Fl_Widget *)this,t,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
               (this->super_Fl_Valuator).super_Fl_Widget.h_);
  }
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar4 = (this->super_Fl_Valuator).super_Fl_Widget.label_.color;
    if (iVar7 == 0) {
      FVar4 = fl_inactive(FVar4);
    }
    if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
      Fl_Widget::draw_box((Fl_Widget *)this,local_d4[0],X,
                          (this->super_Fl_Valuator).super_Fl_Widget.y_,local_f4,
                          (this->super_Fl_Valuator).super_Fl_Widget.h_,
                          (this->super_Fl_Valuator).super_Fl_Widget.color_);
      fl_draw_symbol("@-4<<",X,(this->super_Fl_Valuator).super_Fl_Widget.y_,local_f4,
                     (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar4);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,local_d4[1],local_e0,
                        (this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                        (this->super_Fl_Valuator).super_Fl_Widget.h_,
                        (this->super_Fl_Valuator).super_Fl_Widget.color_);
    fl_draw_symbol("@-4<",local_e0,(this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                   (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar4);
    Fl_Widget::draw_box((Fl_Widget *)this,local_d4[2],local_ec,
                        (this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                        (this->super_Fl_Valuator).super_Fl_Widget.h_,
                        (this->super_Fl_Valuator).super_Fl_Widget.color_);
    fl_draw_symbol("@-4>",local_ec,(this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                   (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar4);
    if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
      Fl_Widget::draw_box((Fl_Widget *)this,local_d4[3],local_f0,
                          (this->super_Fl_Valuator).super_Fl_Widget.y_,local_f4,
                          (this->super_Fl_Valuator).super_Fl_Widget.h_,
                          (this->super_Fl_Valuator).super_Fl_Widget.color_);
      fl_draw_symbol("@-4>>",local_f0,(this->super_Fl_Valuator).super_Fl_Widget.y_,local_f4,
                     (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar4);
    }
  }
  return;
}

Assistant:

void Fl_Counter::draw() {
  int i; Fl_Boxtype boxtype[5];
  Fl_Color selcolor;

  boxtype[0] = box();
  if (boxtype[0] == FL_UP_BOX) boxtype[0] = FL_DOWN_BOX;
  if (boxtype[0] == FL_THIN_UP_BOX) boxtype[0] = FL_THIN_DOWN_BOX;
  for (i=1; i<5; i++)
    if (mouseobj == i)
      boxtype[i] = fl_down(box());
    else
      boxtype[i] = box();

  int xx[5], ww[5];
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    xx[1] = x();	 ww[1] = W;
    xx[2] = x()+1*W;     ww[2] = W;
    xx[0] = x()+2*W;     ww[0] = w()-4*W;
    xx[3] = x()+w()-2*W; ww[3] = W;
    xx[4] = x()+w()-1*W; ww[4] = W;
  } else {
    int W = w()*20/100;
    xx[1] = 0;	         ww[1] = 0;
    xx[2] = x();	 ww[2] = W;
    xx[0] = x()+W;	 ww[0] = w()-2*W;
    xx[3] = x()+w()-1*W; ww[3] = W;
    xx[4] = 0;	         ww[4] = 0;
  }

  draw_box(boxtype[0], xx[0], y(), ww[0], h(), FL_BACKGROUND2_COLOR);
  fl_font(textfont(), textsize());
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  char str[128]; format(str);
  fl_draw(str, xx[0], y(), ww[0], h(), FL_ALIGN_CENTER);
  if (Fl::focus() == this) draw_focus(boxtype[0], xx[0], y(), ww[0], h());
  if (!(damage()&FL_DAMAGE_ALL)) return; // only need to redraw text

  if (active_r())
    selcolor = labelcolor();
  else
    selcolor = fl_inactive(labelcolor());

  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[1], xx[1], y(), ww[1], h(), color());
    fl_draw_symbol("@-4<<", xx[1], y(), ww[1], h(), selcolor);
  }
  draw_box(boxtype[2], xx[2], y(), ww[2], h(), color());
  fl_draw_symbol("@-4<",  xx[2], y(), ww[2], h(), selcolor);
  draw_box(boxtype[3], xx[3], y(), ww[3], h(), color());
  fl_draw_symbol("@-4>",  xx[3], y(), ww[3], h(), selcolor);
  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[4], xx[4], y(), ww[4], h(), color());
    fl_draw_symbol("@-4>>", xx[4], y(), ww[4], h(), selcolor);
  }
}